

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PipelineExecutor::Sink(PipelineExecutor *this,DataChunk *chunk,OperatorSinkInput *input)

{
  int iVar1;
  PhysicalOperator *pPVar2;
  
  pPVar2 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
  iVar1 = (*pPVar2->_vptr_PhysicalOperator[0x1a])
                    (pPVar2,&this->context,chunk,input,pPVar2->_vptr_PhysicalOperator[0x1a]);
  return (SinkResultType)iVar1;
}

Assistant:

SinkResultType PipelineExecutor::Sink(DataChunk &chunk, OperatorSinkInput &input) {
	//! Testing feature to enable async sink on every operator
#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_sink_count < debug_blocked_target_count) {
		debug_blocked_sink_count++;

		auto &callback_state = input.interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return SinkResultType::BLOCKED;
	}
#endif
	return pipeline.sink->Sink(context, chunk, input);
}